

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearScan.cpp
# Opt level: O0

void __thiscall
LinearScan::InsertSecondChanceCompensation
          (LinearScan *this,Lifetime **branchRegContent,Lifetime **labelRegContent,
          BranchInstr *branchInstr,LabelInstr *labelInstr)

{
  uint uVar1;
  Lifetime *pLVar2;
  Lifetime *pLVar3;
  Instr *pIVar4;
  bool bVar5;
  BOOLEAN BVar6;
  IRKind IVar7;
  uint32 uVar8;
  BranchInstr *this_00;
  Loop *loop_00;
  Loop *pLVar9;
  LabelInstr *pLVar10;
  bool local_219;
  bool local_209;
  bool local_1e1;
  Lifetime *lifetime_1;
  Lifetime *branchLifetime;
  RegNum reg_2;
  Lifetime *labelLifetime_1;
  RegNum reg_1;
  Lifetime *lifetime;
  Lifetime *labelLifetime;
  BitVector _unit;
  BVIndex reg;
  Loop *loop;
  Lifetime **regContent;
  Lifetime *tmpRegContent [33];
  bool isLoopBackEdge;
  BitVector thrashedRegs;
  Instr *insertionStartInstr;
  Instr *insertionInstr;
  bool hasAirlock;
  Instr *pIStack_50;
  bool needsAirlock;
  Instr *prevInstr;
  LabelInstr *labelInstr_local;
  BranchInstr *branchInstr_local;
  Lifetime **labelRegContent_local;
  Lifetime **branchRegContent_local;
  LinearScan *this_local;
  Instr *local_18;
  
  prevInstr = &labelInstr->super_Instr;
  labelInstr_local = (LabelInstr *)branchInstr;
  branchInstr_local = (BranchInstr *)labelRegContent;
  labelRegContent_local = branchRegContent;
  branchRegContent_local = (Lifetime **)this;
  pIStack_50 = IR::Instr::GetPrevRealInstrOrLabel(&branchInstr->super_Instr);
  bVar5 = IR::BranchInstr::IsConditional((BranchInstr *)labelInstr_local);
  local_1e1 = true;
  if (!bVar5) {
    bVar5 = IR::Instr::IsBranchInstr(pIStack_50);
    if (bVar5) {
      this_00 = IR::Instr::AsBranchInstr(pIStack_50);
      bVar5 = IR::BranchInstr::IsConditional(this_00);
      local_1e1 = true;
      if (bVar5) goto LAB_0076ed6e;
    }
    local_1e1 = IR::BranchInstr::IsMultiBranch((BranchInstr *)labelInstr_local);
  }
LAB_0076ed6e:
  insertionInstr._7_1_ = local_1e1;
  insertionInstr._6_1_ = 0;
  insertionStartInstr = &labelInstr_local->super_Instr;
  thrashedRegs.word = (Type)(labelInstr_local->super_Instr).m_prev;
  BVUnitT<unsigned_long>::BVUnitT((BVUnitT<unsigned_long> *)&stack0xffffffffffffff90,0);
  if (this->regContent == labelRegContent_local) {
    loop_00 = IR::LabelInstr::GetLoop((LabelInstr *)prevInstr);
    js_memcpy_s(&regContent,0x108,this->regContent,0x108);
    labelRegContent_local = (Lifetime **)&regContent;
    AvoidCompensationConflicts
              (this,(LabelInstr *)prevInstr,(BranchInstr *)labelInstr_local,
               (Lifetime **)branchInstr_local,labelRegContent_local,&insertionStartInstr,
               (Instr **)&thrashedRegs,(bool)(insertionInstr._7_1_ & 1),
               (bool *)((long)&insertionInstr + 6));
    labelLifetime = (Lifetime *)(this->secondChanceRegs).word;
    _unit.word._4_4_ = BVUnitT<unsigned_long>::GetNextBit((BVUnitT<unsigned_long> *)&labelLifetime);
    while (_unit.word._4_4_ != 0xffffffff) {
      BVUnitT<unsigned_long>::Clear((BVUnitT<unsigned_long> *)&labelLifetime,_unit.word._4_4_);
      pLVar2 = (Lifetime *)(&(branchInstr_local->super_Instr)._vptr_Instr)[_unit.word._4_4_];
      pLVar3 = labelRegContent_local[_unit.word._4_4_];
      if (((pLVar3 != (Lifetime *)0x0) &&
          (uVar1 = pLVar3->start, uVar8 = IR::Instr::GetNumber(prevInstr), uVar1 < uVar8)) &&
         (uVar1 = pLVar3->lastAllocationStart, uVar8 = IR::Instr::GetNumber(prevInstr),
         uVar8 < uVar1)) {
        pLVar9 = IR::LabelInstr::GetLoop((LabelInstr *)prevInstr);
        BVar6 = BVSparse<Memory::JitArenaAllocator>::Test
                          ((pLVar9->regAlloc).liveOnBackEdgeSyms,(pLVar3->sym->super_Sym).m_id);
        if ((BVar6 != '\0') &&
           (bVar5 = SListBase<IR::Instr_*,_Memory::ArenaAllocator,_RealCount>::Empty
                              (&(pLVar3->defList).
                                super_SListBase<IR::Instr_*,_Memory::ArenaAllocator,_RealCount>),
           !bVar5)) {
          insertionStartInstr =
               EnsureAirlock(this,(bool)(insertionInstr._7_1_ & 1),
                             (bool *)((long)&insertionInstr + 6),insertionStartInstr,
                             (Instr **)&thrashedRegs,(BranchInstr *)labelInstr_local,
                             (LabelInstr *)prevInstr);
          InsertStores(this,pLVar3,pLVar3->reg,(Instr *)thrashedRegs.word);
        }
      }
      if (pLVar3 != pLVar2) {
        bVar5 = NeedsLoopBackEdgeCompensation(this,pLVar3,(LabelInstr *)prevInstr);
        if (bVar5) {
          insertionStartInstr =
               EnsureAirlock(this,(bool)(insertionInstr._7_1_ & 1),
                             (bool *)((long)&insertionInstr + 6),insertionStartInstr,
                             (Instr **)&thrashedRegs,(BranchInstr *)labelInstr_local,
                             (LabelInstr *)prevInstr);
          ReconcileRegContent(this,labelRegContent_local,(Lifetime **)branchInstr_local,
                              (BranchInstr *)labelInstr_local,(LabelInstr *)prevInstr,pLVar3,
                              (RegNum)_unit.word._4_4_,(BitVector *)&stack0xffffffffffffff90,
                              insertionStartInstr,(Instr *)thrashedRegs.word);
        }
        if (((pLVar2 != (Lifetime *)0x0) && ((*(ushort *)&pLVar2->field_0x9c & 1) != 0)) &&
           ((bVar5 = StackSym::IsConst(pLVar2->sym), !bVar5 &&
            (((uVar1 = pLVar2->end, uVar8 = IR::Instr::GetNumber(&labelInstr_local->super_Instr),
              uVar8 <= uVar1 &&
              (BVar6 = BVSparse<Memory::JitArenaAllocator>::Test
                                 ((loop_00->regAlloc).liveOnBackEdgeSyms,
                                  (pLVar2->sym->super_Sym).m_id), BVar6 != '\0')) &&
             (bVar5 = ClearLoopExitIfRegUnused
                                (this,pLVar2,(RegNum)_unit.word._4_4_,
                                 (BranchInstr *)labelInstr_local,loop_00), !bVar5)))))) {
          insertionStartInstr =
               EnsureAirlock(this,(bool)(insertionInstr._7_1_ & 1),
                             (bool *)((long)&insertionInstr + 6),insertionStartInstr,
                             (Instr **)&thrashedRegs,(BranchInstr *)labelInstr_local,
                             (LabelInstr *)prevInstr);
          ReconcileRegContent(this,labelRegContent_local,(Lifetime **)branchInstr_local,
                              (BranchInstr *)labelInstr_local,(LabelInstr *)prevInstr,pLVar2,
                              (RegNum)_unit.word._4_4_,(BitVector *)&stack0xffffffffffffff90,
                              insertionStartInstr,(Instr *)thrashedRegs.word);
        }
      }
      _unit.word._4_4_ =
           BVUnitT<unsigned_long>::GetNextBit((BVUnitT<unsigned_long> *)&labelLifetime);
    }
    for (labelLifetime_1._7_1_ = RegRAX; labelLifetime_1._7_1_ != RegNumCount;
        labelLifetime_1._7_1_ = labelLifetime_1._7_1_ + RegRAX) {
      pLVar2 = (Lifetime *)(&(branchInstr_local->super_Instr)._vptr_Instr)[labelLifetime_1._7_1_];
      if (((pLVar2 != (Lifetime *)0x0) && (bVar5 = StackSym::IsConst(pLVar2->sym), !bVar5)) &&
         (((pLVar2 != labelRegContent_local[labelLifetime_1._7_1_] &&
           ((BVar6 = BVUnitT<unsigned_long>::Test
                               ((BVUnitT<unsigned_long> *)&stack0xffffffffffffff90,
                                (uint)labelLifetime_1._7_1_), BVar6 == '\0' &&
            (BVar6 = BVSparse<Memory::JitArenaAllocator>::Test
                               ((loop_00->regAlloc).liveOnBackEdgeSyms,(pLVar2->sym->super_Sym).m_id
                               ), BVar6 != '\0')))) &&
          (bVar5 = ClearLoopExitIfRegUnused
                             (this,pLVar2,labelLifetime_1._7_1_,(BranchInstr *)labelInstr_local,
                              loop_00), !bVar5)))) {
        insertionStartInstr =
             EnsureAirlock(this,(bool)(insertionInstr._7_1_ & 1),(bool *)((long)&insertionInstr + 6)
                           ,insertionStartInstr,(Instr **)&thrashedRegs,
                           (BranchInstr *)labelInstr_local,(LabelInstr *)prevInstr);
        ReconcileRegContent(this,labelRegContent_local,(Lifetime **)branchInstr_local,
                            (BranchInstr *)labelInstr_local,(LabelInstr *)prevInstr,pLVar2,
                            labelLifetime_1._7_1_,(BitVector *)&stack0xffffffffffffff90,
                            insertionStartInstr,(Instr *)thrashedRegs.word);
      }
    }
    if ((insertionInstr._6_1_ & 1) != 0) {
      (loop_00->regAlloc).hasAirLock = true;
    }
  }
  else {
    for (branchLifetime._7_1_ = RegRAX; branchLifetime._7_1_ != RegNumCount;
        branchLifetime._7_1_ = branchLifetime._7_1_ + RegRAX) {
      pLVar2 = labelRegContent_local[branchLifetime._7_1_];
      pLVar3 = this->regContent[branchLifetime._7_1_];
      if ((pLVar3 != pLVar2) &&
         ((((pLVar2 != (Lifetime *)0x0 || (pLVar3 == (Lifetime *)0x0)) ||
           (uVar1 = pLVar3->start, uVar8 = IR::Instr::GetNumber(&labelInstr_local->super_Instr),
           uVar1 <= uVar8)) || (prevInstr->m_opcode != GeneratorBailInLabel)))) {
        if (((pLVar2 != (Lifetime *)0x0) && ((*(ushort *)&pLVar2->field_0x9c & 1) != 0)) &&
           ((bVar5 = StackSym::IsConst(pLVar2->sym), !bVar5 &&
            (uVar1 = pLVar2->end, uVar8 = IR::Instr::GetNumber(prevInstr), uVar8 < uVar1)))) {
          insertionStartInstr =
               EnsureAirlock(this,(bool)(insertionInstr._7_1_ & 1),
                             (bool *)((long)&insertionInstr + 6),insertionStartInstr,
                             (Instr **)&thrashedRegs,(BranchInstr *)labelInstr_local,
                             (LabelInstr *)prevInstr);
          ReconcileRegContent(this,labelRegContent_local,(Lifetime **)branchInstr_local,
                              (BranchInstr *)labelInstr_local,(LabelInstr *)prevInstr,pLVar2,
                              branchLifetime._7_1_,(BitVector *)&stack0xffffffffffffff90,
                              insertionStartInstr,(Instr *)thrashedRegs.word);
        }
        if (((pLVar3 != (Lifetime *)0x0) && (bVar5 = StackSym::IsConst(pLVar3->sym), !bVar5)) &&
           (uVar1 = pLVar3->start, uVar8 = IR::Instr::GetNumber(&labelInstr_local->super_Instr),
           uVar1 <= uVar8)) {
          insertionStartInstr =
               EnsureAirlock(this,(bool)(insertionInstr._7_1_ & 1),
                             (bool *)((long)&insertionInstr + 6),insertionStartInstr,
                             (Instr **)&thrashedRegs,(BranchInstr *)labelInstr_local,
                             (LabelInstr *)prevInstr);
          ReconcileRegContent(this,labelRegContent_local,(Lifetime **)branchInstr_local,
                              (BranchInstr *)labelInstr_local,(LabelInstr *)prevInstr,pLVar3,
                              branchLifetime._7_1_,(BitVector *)&stack0xffffffffffffff90,
                              insertionStartInstr,(Instr *)thrashedRegs.word);
        }
      }
    }
  }
  if ((insertionInstr._6_1_ & 1) != 0) {
    pIVar4 = insertionStartInstr->m_prev;
    local_18 = pIVar4;
    IVar7 = IR::Instr::GetKind(pIVar4);
    local_209 = true;
    if (IVar7 != InstrKindLabel) {
      local_209 = IR::Instr::IsProfiledLabelInstr(pIVar4);
    }
    pIVar4 = insertionStartInstr;
    if (local_209 != false) {
      this_local = (LinearScan *)insertionStartInstr;
      IVar7 = IR::Instr::GetKind(insertionStartInstr);
      local_219 = true;
      if (IVar7 != InstrKindLabel) {
        local_219 = IR::Instr::IsProfiledLabelInstr(pIVar4);
      }
      if (((local_219 != false) &&
          (pLVar10 = IR::Instr::AsLabelInstr(insertionStartInstr->m_prev),
          ((byte)pLVar10->field_0x78 >> 1 & 1) != 0)) &&
         (pLVar10 = IR::Instr::AsLabelInstr(insertionStartInstr),
         ((byte)pLVar10->field_0x78 >> 1 & 1) == 0)) {
        pLVar10 = IR::Instr::AsLabelInstr(insertionStartInstr->m_prev);
        if (((byte)pLVar10->field_0x78 >> 1 & 1) != 0) {
          pLVar10 = IR::Instr::AsLabelInstr(insertionStartInstr->m_prev);
          pLVar10->field_0x78 = pLVar10->field_0x78 & 0xdf | 0x20;
        }
        pLVar10 = IR::Instr::AsLabelInstr(insertionStartInstr->m_prev);
        pLVar10->field_0x78 = pLVar10->field_0x78 & 0xfd;
      }
    }
  }
  return;
}

Assistant:

void
LinearScan::InsertSecondChanceCompensation(Lifetime ** branchRegContent, Lifetime **labelRegContent,
                                           IR::BranchInstr *branchInstr, IR::LabelInstr *labelInstr)
{
    IR::Instr *prevInstr = branchInstr->GetPrevRealInstrOrLabel();
    bool needsAirlock = branchInstr->IsConditional() || (prevInstr->IsBranchInstr() && prevInstr->AsBranchInstr()->IsConditional()) || branchInstr->IsMultiBranch();
    bool hasAirlock = false;
    IR::Instr *insertionInstr = branchInstr;
    IR::Instr *insertionStartInstr = branchInstr->m_prev;
    // For loop back-edge, we want to keep the insertionStartInstr before the branch as spill need to happen on all paths
    // Pass a dummy instr address to airLockBlock insertion code.
    BitVector thrashedRegs(0);
    bool isLoopBackEdge = (this->regContent == branchRegContent);
    Lifetime * tmpRegContent[RegNumCount];
    Lifetime **regContent = this->regContent;

    if (isLoopBackEdge)
    {
        Loop *loop = labelInstr->GetLoop();

        js_memcpy_s(&tmpRegContent, (RegNumCount * sizeof(Lifetime *)), this->regContent, sizeof(this->regContent));

        branchRegContent = tmpRegContent;
        regContent = tmpRegContent;

#if defined(_M_IX86) || defined(_M_X64)
        // Insert XCHG to avoid some conflicts for int regs
        // Note: no XCHG on ARM or SSE2.  We could however use 3 XOR on ARM...
        this->AvoidCompensationConflicts(labelInstr, branchInstr, labelRegContent, branchRegContent,
                                         &insertionInstr, &insertionStartInstr, needsAirlock, &hasAirlock);
#endif


        FOREACH_BITSET_IN_UNITBV(reg, this->secondChanceRegs, BitVector)
        {
            Lifetime *labelLifetime = labelRegContent[reg];
            Lifetime *lifetime = branchRegContent[reg];

            // 1.  Insert Stores
            //          Lifetime starts before the loop
            //          Lifetime was re-allocated within the loop (i.e.: a load was most likely inserted)
            //          Lifetime is live on back-edge and has unsaved defs.

            if (lifetime && lifetime->start < labelInstr->GetNumber() && lifetime->lastAllocationStart > labelInstr->GetNumber()
                && (labelInstr->GetLoop()->regAlloc.liveOnBackEdgeSyms->Test(lifetime->sym->m_id))
                && !lifetime->defList.Empty())
            {
                insertionInstr = this->EnsureAirlock(needsAirlock, &hasAirlock, insertionInstr, &insertionStartInstr, branchInstr, labelInstr);
                // If the lifetime was second chance allocated inside the loop, there might
                // be spilled loads of this symbol in the loop.  Insert the stores.
                // We don't need to do this if the lifetime was re-allocated before the loop.
                //
                // Note that reg may not be equal to lifetime->reg because of inserted XCHG...
                this->InsertStores(lifetime, lifetime->reg, insertionStartInstr);
            }

            if (lifetime == labelLifetime)
            {
                continue;
            }

            // 2.   MOV labelReg/MEM, branchReg
            //          Move current register to match content at the top of the loop
            if (this->NeedsLoopBackEdgeCompensation(lifetime, labelInstr))
            {
                // Mismatch, we need to insert compensation code
                insertionInstr = this->EnsureAirlock(needsAirlock, &hasAirlock, insertionInstr, &insertionStartInstr, branchInstr, labelInstr);

                // MOV ESI, EAX
                // MOV EDI, ECX
                // MOV ECX, ESI
                // MOV EAX, EDI <<<
                this->ReconcileRegContent(branchRegContent, labelRegContent, branchInstr, labelInstr,
                                          lifetime, (RegNum)reg, &thrashedRegs, insertionInstr, insertionStartInstr);
            }

            // 2.   MOV labelReg, MEM
            //          Lifetime was in a reg at the top of the loop but is spilled right now.
            if (labelLifetime && labelLifetime->isSpilled && !labelLifetime->sym->IsConst() && labelLifetime->end >= branchInstr->GetNumber())
            {
                if (!loop->regAlloc.liveOnBackEdgeSyms->Test(labelLifetime->sym->m_id))
                {
                    continue;
                }
                if (this->ClearLoopExitIfRegUnused(labelLifetime, (RegNum)reg, branchInstr, loop))
                {
                    continue;
                }
                insertionInstr = this->EnsureAirlock(needsAirlock, &hasAirlock, insertionInstr, &insertionStartInstr, branchInstr, labelInstr);

                this->ReconcileRegContent(branchRegContent, labelRegContent, branchInstr, labelInstr,
                                          labelLifetime, (RegNum)reg, &thrashedRegs, insertionInstr, insertionStartInstr);
            }
        } NEXT_BITSET_IN_UNITBV;

        // 3.   MOV labelReg, MEM
        //          Finish up reloading lifetimes needed at the top.  #2 only handled secondChanceRegs.

        FOREACH_REG(reg)
        {
            // Handle lifetimes in a register at the top of the loop, but not currently.
            Lifetime *labelLifetime = labelRegContent[reg];
            if (labelLifetime && !labelLifetime->sym->IsConst() && labelLifetime != branchRegContent[reg] && !thrashedRegs.Test(reg)
                && (loop->regAlloc.liveOnBackEdgeSyms->Test(labelLifetime->sym->m_id)))
            {
                if (this->ClearLoopExitIfRegUnused(labelLifetime, (RegNum)reg, branchInstr, loop))
                {
                    continue;
                }
                // Mismatch, we need to insert compensation code
                insertionInstr = this->EnsureAirlock(needsAirlock, &hasAirlock, insertionInstr, &insertionStartInstr, branchInstr, labelInstr);

                this->ReconcileRegContent(branchRegContent, labelRegContent, branchInstr, labelInstr,
                                            labelLifetime, (RegNum)reg, &thrashedRegs, insertionInstr, insertionStartInstr);
            }
        } NEXT_REG;

        if (hasAirlock)
        {
            loop->regAlloc.hasAirLock = true;
        }
    }
    else
    {
        //
        // Non-loop-back-edge merge
        //
        FOREACH_REG(reg)
        {
            Lifetime *branchLifetime = branchRegContent[reg];
            Lifetime *lifetime = regContent[reg];

            if (lifetime == branchLifetime)
            {
                continue;
            }

            // Allow us to properly insert compensation code for symbols whose lifetimes start after the generator jump table
            // The GeneratorBailInLabel will have 2 edges in: one from the normal flow, one straight from the generator jump table
            if (!branchLifetime && lifetime && lifetime->start > branchInstr->GetNumber() && labelInstr->m_opcode == Js::OpCode::GeneratorBailInLabel)
            {
                continue;
            }

            if (branchLifetime && branchLifetime->isSpilled && !branchLifetime->sym->IsConst() && branchLifetime->end > labelInstr->GetNumber())
            {
                // The lifetime was in a reg at the branch and is now spilled.  We need a store on this path.
                //
                //  MOV  MEM, branch_REG
                insertionInstr = this->EnsureAirlock(needsAirlock, &hasAirlock, insertionInstr, &insertionStartInstr, branchInstr, labelInstr);
                this->ReconcileRegContent(branchRegContent, labelRegContent, branchInstr, labelInstr,
                                          branchLifetime, (RegNum)reg, &thrashedRegs, insertionInstr, insertionStartInstr);
            }
            if (lifetime && !lifetime->sym->IsConst() && lifetime->start <= branchInstr->GetNumber())
            {
                // MOV  label_REG, branch_REG / MEM
                insertionInstr = this->EnsureAirlock(needsAirlock, &hasAirlock, insertionInstr, &insertionStartInstr, branchInstr, labelInstr);
                this->ReconcileRegContent(branchRegContent, labelRegContent, branchInstr, labelInstr,
                                          lifetime, (RegNum)reg, &thrashedRegs, insertionInstr, insertionStartInstr);
            }
        } NEXT_REG;
    }

    if (hasAirlock)
    {
        // Fix opHelper on airlock label.
        if (insertionInstr->m_prev->IsLabelInstr() && insertionInstr->IsLabelInstr())
        {
            if (insertionInstr->m_prev->AsLabelInstr()->isOpHelper && !insertionInstr->AsLabelInstr()->isOpHelper)
            {
                // Ignore assertion error for cases where we insert an "airlock" helper block
                // for a Branch instruction's helper path that:
                //  1) ends up being empty
                //  2) comes after a helper block from another instruction
                //  3) is followed by a non-helper block
                //
                // Currently we would mark this block as a non-helper, but that makes
                // this block only reachable through helper blocks, thus failing the assert 
#if DBG
                if (insertionInstr->m_prev->AsLabelInstr()->isOpHelper)
                {
                    insertionInstr->m_prev->AsLabelInstr()->m_noHelperAssert = true;
                }
#endif
                insertionInstr->m_prev->AsLabelInstr()->isOpHelper = false;
            }
        }
    }
}